

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_suite.cpp
# Opt level: O0

void string_suite::test_space(void)

{
  string local_210 [36];
  undefined4 local_1ec;
  size_type local_1e8 [2];
  undefined1 local_1d8 [8];
  encoder_type encoder;
  allocator<char> local_1a1;
  undefined1 local_1a0 [8];
  string text;
  ostringstream result;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(text.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1a0," ",&local_1a1);
  std::allocator<char>::~allocator(&local_1a1);
  trial::protocol::json::detail::basic_encoder<char,24ul>::
  basic_encoder<std::__cxx11::ostringstream>
            ((basic_encoder<char,24ul> *)local_1d8,
             (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (text.field_2._M_local_buf + 8));
  local_1e8[0] = trial::protocol::json::detail::basic_encoder<char,24ul>::
                 value<std::__cxx11::string>
                           ((basic_encoder<char,24ul> *)local_1d8,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_1a0);
  local_1ec = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value(text)","3",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x23d,"void string_suite::test_space()",local_1e8,&local_1ec);
  std::__cxx11::ostringstream::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[4]>
            ("result.str()","\"\\\" \\\"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x23e,"void string_suite::test_space()",local_210,"\" \"");
  std::__cxx11::string::~string(local_210);
  trial::protocol::json::detail::basic_encoder<char,_24UL>::~basic_encoder
            ((basic_encoder<char,_24UL> *)local_1d8);
  std::__cxx11::string::~string((string *)local_1a0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(text.field_2._M_local_buf + 8));
  return;
}

Assistant:

void test_space()
{
    std::ostringstream result;
    std::string text(" ");
    encoder_type encoder(result);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value(text), 3);
    TRIAL_PROTOCOL_TEST_EQUAL(result.str(), "\" \"");
}